

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

bool dgrminer::operator<(labeled_edge_with_occurrences *lhs,labeled_edge_with_occurrences *rhs)

{
  int iVar1;
  const_reference pvVar2;
  int local_24;
  int i;
  labeled_edge_with_occurrences *rhs_local;
  labeled_edge_with_occurrences *lhs_local;
  
  local_24 = 0;
  while( true ) {
    if (6 < local_24) {
      return false;
    }
    pvVar2 = std::array<int,_8UL>::operator[](&lhs->elements,(long)local_24);
    iVar1 = *pvVar2;
    pvVar2 = std::array<int,_8UL>::operator[](&rhs->elements,(long)local_24);
    if (iVar1 < *pvVar2) break;
    pvVar2 = std::array<int,_8UL>::operator[](&lhs->elements,(long)local_24);
    iVar1 = *pvVar2;
    pvVar2 = std::array<int,_8UL>::operator[](&rhs->elements,(long)local_24);
    if (*pvVar2 < iVar1) {
      return false;
    }
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

inline bool operator<(const labeled_edge_with_occurrences& lhs, const labeled_edge_with_occurrences& rhs)
	{
		// look at the first 7 elements only (dont take the 8th one - the ID of the edge)
		for (int i = 0; i < 7; i++) {
			if (lhs.elements[i] < rhs.elements[i])
			{
				return true;
			}
			else if (lhs.elements[i] > rhs.elements[i])
			{
				return false;
			}
		}
		return false;
	}